

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeys_test.cpp
# Opt level: O2

void __thiscall jbcoin::tests::ValidatorKeys_test::testWriteToFile(ValidatorKeys_test *this)

{
  bool bVar1;
  string subdir;
  path keyFile;
  ValidatorKeys fileKeys;
  KeyFileGuard g;
  KeyFileGuard g_1;
  path conflictingPath;
  KeyType keyType;
  path keyFile_3;
  ValidatorKeys keys;
  string sStack_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ValidatorKeys local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  KeyFileGuard local_1a8;
  ValidatorKeys local_180;
  path local_120;
  KeyType local_fc;
  path local_f8;
  ValidatorKeys local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  optional_base<jbcoin::ValidatorToken> local_58;
  
  std::__cxx11::string::string((string *)&local_d8,"Write to File",(allocator *)&local_228);
  beast::unit_test::suite::testcase_t::operator()
            (&(this->super_suite).testcase,(string *)&local_d8,no_abort_on_fail);
  std::__cxx11::string::~string((string *)&local_d8);
  local_fc = ed25519;
  ValidatorKeys::ValidatorKeys(&local_d8,&local_fc);
  std::__cxx11::string::string((string *)&sStack_268,"test_key_file",(allocator *)&local_228);
  std::__cxx11::string::string((string *)&local_228,(string *)&sStack_268);
  boost::filesystem::path::path((path *)&local_180,"validator_keys.json");
  boost::filesystem::operator/((path *)&local_248,(path *)&local_228,(path *)&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_228);
  KeyFileGuard::KeyFileGuard(&local_1a8,&this->super_suite,&sStack_268);
  ValidatorKeys::writeToFile(&local_d8,(path *)&local_248);
  local_228.keyType_._0_1_ = boost::filesystem::exists((path *)&local_248);
  beast::unit_test::suite::expect<bool>
            (&this->super_suite,(bool *)&local_228,
             "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
             ,0x138);
  ValidatorKeys::make_ValidatorKeys(&local_228,(path *)&local_248);
  bVar1 = ValidatorKeys::operator==(&local_d8,&local_228);
  local_180.keyType_ = CONCAT31(local_180.keyType_._1_3_,bVar1);
  beast::unit_test::suite::expect<bool>
            (&this->super_suite,(bool *)&local_180,
             "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
             ,0x13b);
  local_180.keyType_ = secp256k1;
  ValidatorKeys::createValidatorToken
            ((optional<jbcoin::ValidatorToken> *)&local_58,&local_d8,&local_180.keyType_);
  boost::optional_detail::optional_base<jbcoin::ValidatorToken>::~optional_base(&local_58);
  ValidatorKeys::writeToFile(&local_d8,(path *)&local_248);
  ValidatorKeys::make_ValidatorKeys(&local_180,(path *)&local_248);
  ValidatorKeys::operator=(&local_228,&local_180);
  SecretKey::~SecretKey(&local_180.secretKey_);
  bVar1 = ValidatorKeys::operator==(&local_d8,&local_228);
  local_180.keyType_ = CONCAT31(local_180.keyType_._1_3_,bVar1);
  beast::unit_test::suite::expect<bool>
            (&this->super_suite,(bool *)&local_180,
             "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
             ,0x142);
  SecretKey::~SecretKey(&local_228.secretKey_);
  KeyFileGuard::~KeyFileGuard(&local_1a8);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&sStack_268);
  boost::filesystem::path::path((path *)&local_228,"test_validator_keys.json");
  bVar1 = boost::filesystem::exists((path *)&local_228);
  if (!bVar1) {
    ValidatorKeys::writeToFile(&local_d8,(path *)&local_228);
    std::__cxx11::string::string((string *)&local_180,(string *)&local_228);
    boost::filesystem::remove((char *)&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::string((string *)&local_1a8,"test_key_file",(allocator *)&local_228);
    std::__cxx11::string::string((string *)&local_228,(string *)&local_1a8);
    boost::filesystem::path::path((path *)&local_180,"directories/to/create/validator_keys.json");
    boost::filesystem::operator/((path *)&sStack_268,(path *)&local_228,(path *)&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_228);
    KeyFileGuard::KeyFileGuard((KeyFileGuard *)&local_180,&this->super_suite,(string *)&local_1a8);
    ValidatorKeys::writeToFile(&local_d8,(path *)&sStack_268);
    local_228.keyType_._0_1_ = boost::filesystem::exists((path *)&sStack_268);
    beast::unit_test::suite::expect<bool>
              (&this->super_suite,(bool *)&local_228,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0x15c);
    ValidatorKeys::make_ValidatorKeys(&local_228,(path *)&sStack_268);
    bVar1 = ValidatorKeys::operator==(&local_d8,&local_228);
    local_248._M_dataplus._M_p._0_1_ = bVar1;
    beast::unit_test::suite::expect<bool>
              (&this->super_suite,(bool *)&local_248,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0x15f);
    SecretKey::~SecretKey(&local_228.secretKey_);
    KeyFileGuard::~KeyFileGuard((KeyFileGuard *)&local_180);
    std::__cxx11::string::~string((string *)&sStack_268);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::string((string *)&local_180,"test_key_file",(allocator *)&local_228);
    KeyFileGuard::KeyFileGuard((KeyFileGuard *)&local_228,&this->super_suite,(string *)&local_180);
    std::__cxx11::string::string((string *)&sStack_268,(string *)&local_180);
    boost::filesystem::path::path((path *)&local_248,".");
    boost::filesystem::operator/(&local_1a8.subDir_,(path *)&sStack_268,(path *)&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&sStack_268);
    std::operator+(&sStack_268,"Cannot open key file: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8);
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    local_248._M_string_length = 0;
    local_248.field_2._M_local_buf[0] = '\0';
    ValidatorKeys::writeToFile(&local_d8,&local_1a8.subDir_);
    local_f8.m_pathname._M_dataplus._M_p._0_1_ =
         (string)std::operator==(&local_248,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&sStack_268);
    beast::unit_test::suite::expect<bool>
              (&this->super_suite,(bool *)&local_f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0x16e);
    std::__cxx11::string::string((string *)&local_120,(string *)&local_180);
    boost::filesystem::path::path((path *)&local_1c8,"validator_keys.json");
    boost::filesystem::operator/(&local_f8,&local_120,(path *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_120);
    ValidatorKeys::writeToFile(&local_d8,&local_f8);
    boost::filesystem::path::path((path *)&local_1c8,"validators_keys.json");
    boost::filesystem::operator/(&local_120,&local_f8,(path *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    boost::filesystem::path::parent_path();
    std::operator+(&local_1c8,"Cannot create directory: ",&local_78);
    std::__cxx11::string::operator=((string *)&sStack_268,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_78);
    ValidatorKeys::writeToFile(&local_d8,&local_120);
    local_1c8._M_dataplus._M_p._0_1_ =
         std::operator==(&local_248,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &sStack_268);
    beast::unit_test::suite::expect<bool>
              (&this->super_suite,(bool *)&local_1c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0x17c);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&sStack_268);
    std::__cxx11::string::~string((string *)&local_1a8);
    KeyFileGuard::~KeyFileGuard((KeyFileGuard *)&local_228);
    std::__cxx11::string::~string((string *)&local_180);
    SecretKey::~SecretKey(&local_d8.secretKey_);
    return;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_180,
                 "Cannot create key file: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_228);
  Throw<std::runtime_error,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_180);
}

Assistant:

void
    testWriteToFile ()
    {
        testcase ("Write to File");

        using namespace boost::filesystem;

        auto const keyType = KeyType::ed25519;
        ValidatorKeys keys (keyType);

        {
            std::string const subdir = "test_key_file";
            path const keyFile = subdir / "validator_keys.json";
            KeyFileGuard g (*this, subdir);

            keys.writeToFile (keyFile);
            BEAST_EXPECT(exists (keyFile));

            auto fileKeys = ValidatorKeys::make_ValidatorKeys (keyFile);
            BEAST_EXPECT (keys == fileKeys);

            // Overwrite file with new sequence
            keys.createValidatorToken (KeyType::secp256k1);
            keys.writeToFile (keyFile);

            fileKeys = ValidatorKeys::make_ValidatorKeys (keyFile);
            BEAST_EXPECT (keys == fileKeys);
        }
        {
            // Write to key file in current relative directory
            path const keyFile = "test_validator_keys.json";
            if (!exists (keyFile))
            {
                keys.writeToFile (keyFile);
                remove (keyFile.string());
            }
            else
            {
                // Cannot run the test. Someone created a file
                // where we want to put our key file
                Throw<std::runtime_error> (
                    "Cannot create key file: " + keyFile.string ());
            }
        }
        {
            // Create key file directory
            std::string const subdir = "test_key_file";
            path const keyFile =
                subdir / "directories/to/create/validator_keys.json";
            KeyFileGuard g (*this, subdir);

            keys.writeToFile (keyFile);
            BEAST_EXPECT(exists (keyFile));

            auto const fileKeys = ValidatorKeys::make_ValidatorKeys (keyFile);
            BEAST_EXPECT (keys == fileKeys);
        }
        {
            // Fail if file cannot be opened for write
            std::string const subdir = "test_key_file";
            KeyFileGuard g (*this, subdir);

            path const badKeyFile = subdir / ".";
            auto expectedError = "Cannot open key file: " + badKeyFile.string();
            std::string error;
            try {
                keys.writeToFile (badKeyFile);
            } catch (std::runtime_error& e) {
                error = e.what();
            }
            BEAST_EXPECT(error == expectedError);

            // Fail if parent directory is existing file
            path const keyFile = subdir / "validator_keys.json";
            keys.writeToFile (keyFile);
            path const conflictingPath =
                keyFile / "validators_keys.json";
            expectedError = "Cannot create directory: " +
                conflictingPath.parent_path().string();
            try {
                keys.writeToFile (conflictingPath);
            } catch (std::runtime_error& e) {
                error = e.what();
            }
            BEAST_EXPECT(error == expectedError);
        }
    }